

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O0

int fe_shift_frame(fe_t *fe,int16 *in,int32 len)

{
  int iVar1;
  long lVar2;
  int local_24;
  int i;
  int offset;
  int32 len_local;
  int16 *in_local;
  fe_t *fe_local;
  
  i = len;
  if (fe->frame_shift < len) {
    i = (int)fe->frame_shift;
  }
  iVar1 = (int)fe->frame_size - (int)fe->frame_shift;
  memmove(fe->spch,fe->spch + (int)fe->frame_shift,(long)iVar1 << 1);
  memcpy(fe->spch + iVar1,in,(long)i << 1);
  if (fe->swap != '\0') {
    for (local_24 = 0; local_24 < i; local_24 = local_24 + 1) {
      fe->spch[iVar1 + local_24] =
           (ushort)fe->spch[iVar1 + local_24] >> 8 | fe->spch[iVar1 + local_24] << 8;
    }
  }
  if (fe->dither != '\0') {
    for (local_24 = 0; local_24 < i; local_24 = local_24 + 1) {
      lVar2 = genrand_int31();
      fe->spch[iVar1 + local_24] = fe->spch[iVar1 + local_24] + (ushort)(lVar2 % 4 == 0);
    }
  }
  iVar1 = fe_spch_to_frame(fe,iVar1 + i);
  return iVar1;
}

Assistant:

int
fe_shift_frame(fe_t * fe, int16 const *in, int32 len)
{
    int offset, i;

    if (len > fe->frame_shift)
        len = fe->frame_shift;
    offset = fe->frame_size - fe->frame_shift;

    /* Shift data into the raw speech buffer. */
    memmove(fe->spch, fe->spch + fe->frame_shift,
            offset * sizeof(*fe->spch));
    memcpy(fe->spch + offset, in, len * sizeof(*fe->spch));
    /* Swap and dither if necessary. */
    if (fe->swap)
        for (i = 0; i < len; ++i)
            SWAP_INT16(&fe->spch[offset + i]);
    if (fe->dither)
        for (i = 0; i < len; ++i)
            fe->spch[offset + i]
                += (int16) ((!(s3_rand_int31() % 4)) ? 1 : 0);

    return fe_spch_to_frame(fe, offset + len);
}